

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_decompressSequences_bmi2
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  BYTE *pBVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  sbyte sVar8;
  undefined8 uVar9;
  seq_t sequence;
  bool bVar10;
  U32 i;
  uint uVar11;
  long lVar12;
  BYTE *pBVar13;
  ulong uVar14;
  uint uVar15;
  BYTE *oend;
  BYTE *pBVar16;
  ulong __n;
  size_t unaff_RBX;
  BYTE *__dest;
  size_t sVar17;
  int iVar18;
  size_t sVar19;
  BYTE *pBVar20;
  BYTE *litPtr;
  BIT_DStream_t local_108;
  ZSTD_fseState local_e0;
  ZSTD_fseState local_d0;
  ZSTD_fseState local_c0;
  size_t local_b0 [3];
  BYTE *local_98 [3];
  ulong local_80;
  ulong uStack_78;
  size_t local_70;
  size_t local_68;
  BYTE *local_60;
  BYTE *local_58;
  BYTE *local_50;
  BYTE *local_48;
  ulong local_40;
  ulong local_38;
  
  if (dctx->litBufferLocation == ZSTD_not_in_dst) {
    oend = (BYTE *)(maxDstSize + (long)dst);
  }
  else {
    oend = dctx->litBuffer;
  }
  local_98[1] = dctx->litPtr;
  local_98[2] = local_98[1] + dctx->litSize;
  pBVar20 = (BYTE *)dst;
  if (nbSeq == 0) goto LAB_001e2a83;
  local_50 = (BYTE *)dctx->prefixStart;
  local_58 = (BYTE *)dctx->virtualStart;
  local_60 = (BYTE *)dctx->dictEnd;
  dctx->fseEntropy = 1;
  lVar12 = -0xc;
  do {
    *(ulong *)((long)local_98 + lVar12 * 2) =
         (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar12);
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0);
  local_98[0] = (BYTE *)dst;
  if (seqSize == 0) {
    local_108.ptr = (char *)0x0;
    local_108.start = (char *)0x0;
    local_108.bitContainer = 0;
    local_108._8_8_ = 0;
    local_108.limitPtr = (char *)0x0;
LAB_001e223d:
    bVar10 = false;
    unaff_RBX = 0xffffffffffffffec;
  }
  else {
    local_108.limitPtr = (char *)((long)seqStart + 8);
    local_108.start = (char *)seqStart;
    if (seqSize < 8) {
      local_108.bitContainer = (size_t)*seqStart;
      switch(seqSize) {
      case 7:
        local_108.bitContainer =
             (ulong)*(byte *)((long)seqStart + 6) << 0x30 | local_108.bitContainer;
      case 6:
        local_108.bitContainer =
             local_108.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
      case 5:
        local_108.bitContainer =
             local_108.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
      case 4:
        local_108.bitContainer =
             local_108.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
      case 3:
        local_108.bitContainer =
             local_108.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
      case 2:
        local_108.bitContainer =
             local_108.bitContainer + (ulong)*(byte *)((long)seqStart + 1) * 0x100;
      }
      bVar2 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar11 = (uint)bVar2;
      local_108.bitsConsumed = (LZCOUNT(uVar11) ^ 0xffffffe0U) + 9;
      if (uVar11 == 0) {
        local_108.bitsConsumed = (uint)bVar2;
      }
      local_108.ptr = (char *)seqStart;
      if (uVar11 == 0) goto LAB_001e223d;
      local_108.bitsConsumed = local_108.bitsConsumed + (int)seqSize * -8 + 0x40;
    }
    else {
      local_108.ptr = (char *)((long)seqStart + (seqSize - 8));
      local_108.bitContainer = *(size_t *)local_108.ptr;
      bVar2 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar11 = (uint)bVar2;
      local_108.bitsConsumed = (LZCOUNT(uVar11) ^ 0xffffffe0U) + 9;
      if (uVar11 == 0) {
        local_108.bitsConsumed = (uint)bVar2;
      }
      if (uVar11 == 0 || 0xffffffffffffff88 < seqSize) goto LAB_001e223d;
    }
    ZSTD_initFseState(&local_e0,&local_108,dctx->LLTptr);
    ZSTD_initFseState(&local_d0,&local_108,dctx->OFTptr);
    ZSTD_initFseState(&local_c0,&local_108,dctx->MLTptr);
    if (local_98[0] == (BYTE *)0x0) {
      __assert_fail("dst != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xaabe,
                    "size_t ZSTD_decompressSequences_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e, const int)"
                   );
    }
    local_48 = oend + -0x20;
    dst = local_98[0];
    do {
      sVar19 = local_b0[1];
      bVar2 = local_e0.table[local_e0.state].nbAdditionalBits;
      if (0x10 < bVar2) {
        __assert_fail("llBits <= MaxLLBits",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa948,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
      }
      bVar3 = local_c0.table[local_c0.state].nbAdditionalBits;
      if (0x10 < bVar3) {
        __assert_fail("mlBits <= MaxMLBits",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa949,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
      }
      bVar4 = local_d0.table[local_d0.state].nbAdditionalBits;
      if (0x1f < bVar4) {
        __assert_fail("ofBits <= MaxOff",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa94a,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
      }
      uStack_78 = (ulong)local_c0.table[local_c0.state].baseValue;
      uVar11 = local_e0.table[local_e0.state].baseValue;
      local_80 = (ulong)uVar11;
      local_40 = (ulong)local_c0.table[local_c0.state].nextState;
      local_38 = (ulong)local_d0.table[local_d0.state].nextState;
      bVar5 = local_e0.table[local_e0.state].nbBits;
      bVar6 = local_c0.table[local_c0.state].nbBits;
      bVar7 = local_d0.table[local_d0.state].nbBits;
      if (bVar4 < 2) {
        if (bVar4 == 0) {
          sVar17 = local_b0[uVar11 == 0];
          local_b0[0] = local_b0[uVar11 != 0];
        }
        else {
          uVar14 = local_108._8_8_ & 0x3f;
          local_108.bitsConsumed = local_108.bitsConsumed + 1;
          lVar12 = (ulong)(local_d0.table[local_d0.state].baseValue + (uint)(uVar11 == 0)) -
                   ((long)(local_108.bitContainer << uVar14) >> 0x3f);
          if (lVar12 == 3) {
            sVar17 = local_b0[0] - 1;
          }
          else {
            sVar17 = local_b0[lVar12];
          }
          sVar17 = sVar17 + (sVar17 == 0);
          if (lVar12 != 1) {
            local_b0[2] = local_b0[1];
          }
        }
        local_b0[1] = local_b0[0];
      }
      else {
        uVar14 = local_108._8_8_ & 0x3f;
        local_108.bitsConsumed = local_108.bitsConsumed + bVar4;
        sVar17 = ((local_108.bitContainer << uVar14) >> ((ulong)(byte)-bVar4 & 0x3f)) +
                 (ulong)local_d0.table[local_d0.state].baseValue;
        local_b0[1] = local_b0[0];
        local_b0[2] = sVar19;
      }
      local_b0[0] = sVar17;
      if (bVar3 != 0) {
        uVar14 = local_108._8_8_ & 0x3f;
        local_108.bitsConsumed = local_108.bitsConsumed + bVar3;
        uStack_78 = uStack_78 + ((local_108.bitContainer << uVar14) >> ((ulong)(byte)-bVar3 & 0x3f))
        ;
      }
      if ((0x1e < (byte)(bVar3 + bVar2 + bVar4)) && (local_108.bitsConsumed < 0x41)) {
        if (local_108.ptr < local_108.limitPtr) {
          if (local_108.ptr == local_108.start) goto LAB_001e24b2;
          uVar14 = (ulong)(uint)((int)local_108.ptr - (int)local_108.start);
          if (local_108.start <=
              (ulong *)((long)local_108.ptr - (ulong)(local_108.bitsConsumed >> 3))) {
            uVar14 = (ulong)(local_108.bitsConsumed >> 3);
          }
          uVar11 = local_108.bitsConsumed + (int)uVar14 * -8;
        }
        else {
          uVar14 = (ulong)(local_108.bitsConsumed >> 3);
          uVar11 = local_108.bitsConsumed & 7;
        }
        local_108.ptr = (char *)((long)local_108.ptr - uVar14);
        local_108.bitsConsumed = uVar11;
        local_108.bitContainer = *(size_t *)local_108.ptr;
      }
LAB_001e24b2:
      if (bVar2 != 0) {
        uVar14 = local_108._8_8_ & 0x3f;
        local_108.bitsConsumed = local_108.bitsConsumed + bVar2;
        local_80 = local_80 + ((local_108.bitContainer << uVar14) >> ((ulong)(byte)-bVar2 & 0x3f));
      }
      sVar8 = (bVar5 < 0x41) * ('@' - bVar5);
      local_e0.state =
           (((local_108.bitContainer >>
             ((ulong)(byte)-(char)(bVar5 + local_108.bitsConsumed) & 0x3f)) << sVar8) >> sVar8) +
           (ulong)local_e0.table[local_e0.state].nextState;
      iVar18 = bVar5 + local_108.bitsConsumed + (uint)bVar6;
      sVar8 = (bVar6 < 0x41) * ('@' - bVar6);
      local_c0.state =
           (((local_108.bitContainer >> ((ulong)(byte)-(char)iVar18 & 0x3f)) << sVar8) >> sVar8) +
           (ulong)local_c0.table[local_c0.state].nextState;
      iVar18 = iVar18 + (uint)bVar7;
      local_108.bitsConsumed = iVar18;
      sVar8 = (bVar7 < 0x41) * ('@' - bVar7);
      local_d0.state =
           (((local_108.bitContainer >> ((ulong)(byte)-(char)iVar18 & 0x3f)) << sVar8) >> sVar8) +
           (ulong)local_d0.table[local_d0.state].nextState;
      local_70 = sVar17;
      pBVar20 = local_98[1] + local_80;
      if (local_98[2] < pBVar20) {
LAB_001e278a:
        sequence.matchLength = uStack_78;
        sequence.litLength = local_80;
        sequence.offset = sVar17;
        sVar19 = ZSTD_execSequenceEnd
                           ((BYTE *)dst,oend,sequence,local_98 + 1,local_98[2],local_50,local_58,
                            local_60);
      }
      else {
        sVar19 = uStack_78 + local_80;
        pBVar1 = (BYTE *)((long)dst + sVar19);
        if (local_48 < pBVar1) goto LAB_001e278a;
        if ((long)local_80 < 0) {
          __assert_fail("op <= oLitEnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa863,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if ((long)sVar19 <= (long)local_80) {
          __assert_fail("oLitEnd < oMatchEnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa864,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if (oend < pBVar1) {
          __assert_fail("oMatchEnd <= oend",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa865,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        __dest = (BYTE *)((long)dst + local_80);
        if (local_48 < __dest) {
          __assert_fail("oLitEnd <= oend_w",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa867,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        uVar9 = *(undefined8 *)(local_98[1] + 8);
        *(undefined8 *)dst = *(undefined8 *)local_98[1];
        *(undefined8 *)((long)dst + 8) = uVar9;
        if (0x10 < local_80) {
          ZSTD_decompressSequences_bmi2_cold_1();
        }
        pBVar13 = local_50;
        local_98[1] = pBVar20;
        pBVar20 = __dest + -sVar17;
        if ((ulong)((long)__dest - (long)local_50) < local_70) {
          if ((ulong)((long)__dest - (long)local_58) < local_70) {
            sVar19 = 0xffffffffffffffec;
          }
          else {
            lVar12 = (long)(__dest + -sVar17) - (long)local_50;
            pBVar20 = local_60 + lVar12;
            if (local_60 < pBVar20 + uStack_78) {
              memmove(__dest,pBVar20,-lVar12);
              __dest = __dest + -lVar12;
              uStack_78 = uStack_78 + lVar12;
              pBVar20 = pBVar13;
              goto LAB_001e2658;
            }
            memmove(__dest,pBVar20,uStack_78);
          }
        }
        else {
LAB_001e2658:
          if (pBVar1 < __dest) {
            __assert_fail("op <= oMatchEnd",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa888,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (pBVar20 < pBVar13) {
            __assert_fail("match >= prefixStart",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa88a,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (uStack_78 == 0) {
            __assert_fail("sequence.matchLength >= 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa88b,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (local_70 < 0x10) {
            if (__dest < pBVar20) {
              __assert_fail("*ip <= *op",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa783,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
            }
            if (local_70 < 8) {
              iVar18 = *(int *)(ZSTD_overlapCopy8_dec64table + local_70 * 4);
              *__dest = *pBVar20;
              __dest[1] = pBVar20[1];
              __dest[2] = pBVar20[2];
              __dest[3] = pBVar20[3];
              pBVar13 = pBVar20 + *(uint *)(ZSTD_overlapCopy8_dec32table + local_70 * 4);
              pBVar20 = pBVar20 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + local_70 * 4) -
                                  (long)iVar18);
              *(undefined4 *)(__dest + 4) = *(undefined4 *)pBVar13;
            }
            else {
              *(undefined8 *)__dest = *(undefined8 *)pBVar20;
            }
            pBVar13 = pBVar20 + 8;
            pBVar16 = __dest + 8;
            lVar12 = (long)pBVar16 - (long)pBVar13;
            if (lVar12 < 8) {
              __assert_fail("*op - *ip >= 8",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa795,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
            }
            if (8 < uStack_78) {
              if (pBVar1 <= pBVar16) {
                __assert_fail("op < oMatchEnd",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa89f,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              if (lVar12 < 0x10) {
                do {
                  *(undefined8 *)pBVar16 = *(undefined8 *)pBVar13;
                  pBVar16 = pBVar16 + 8;
                  pBVar13 = pBVar13 + 8;
                } while (pBVar16 < __dest + uStack_78);
              }
              else {
                if (0xffffffffffffffe0 < lVar12 - 0x10U) goto LAB_001e2c93;
                uVar9 = *(undefined8 *)(pBVar20 + 0x10);
                *(undefined8 *)pBVar16 = *(undefined8 *)pBVar13;
                *(undefined8 *)(__dest + 0x10) = uVar9;
                if (0x18 < (long)uStack_78) {
                  lVar12 = 0;
                  do {
                    uVar9 = *(undefined8 *)(pBVar20 + lVar12 + 0x18 + 8);
                    pBVar1 = __dest + lVar12 + 0x18;
                    *(undefined8 *)pBVar1 = *(undefined8 *)(pBVar20 + lVar12 + 0x18);
                    *(undefined8 *)(pBVar1 + 8) = uVar9;
                    uVar9 = *(undefined8 *)(pBVar20 + lVar12 + 0x28 + 8);
                    *(undefined8 *)(pBVar1 + 0x10) = *(undefined8 *)(pBVar20 + lVar12 + 0x28);
                    *(undefined8 *)(pBVar1 + 0x18) = uVar9;
                    lVar12 = lVar12 + 0x20;
                  } while (pBVar1 + 0x20 < __dest + uStack_78);
                }
              }
            }
          }
          else {
            if ((BYTE *)0xffffffffffffffe0 < __dest + (-0x10 - (long)pBVar20)) {
LAB_001e2c93:
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar9 = *(undefined8 *)(pBVar20 + 8);
            *(undefined8 *)__dest = *(undefined8 *)pBVar20;
            *(undefined8 *)(__dest + 8) = uVar9;
            if (0x10 < (long)uStack_78) {
              lVar12 = 0x10;
              do {
                uVar9 = *(undefined8 *)(pBVar20 + lVar12 + 8);
                pBVar1 = __dest + lVar12;
                *(undefined8 *)pBVar1 = *(undefined8 *)(pBVar20 + lVar12);
                *(undefined8 *)(pBVar1 + 8) = uVar9;
                uVar9 = *(undefined8 *)(pBVar20 + lVar12 + 0x10 + 8);
                *(undefined8 *)(pBVar1 + 0x10) = *(undefined8 *)(pBVar20 + lVar12 + 0x10);
                *(undefined8 *)(pBVar1 + 0x18) = uVar9;
                lVar12 = lVar12 + 0x20;
              } while (pBVar1 + 0x20 < __dest + uStack_78);
            }
          }
        }
      }
      if (sVar19 < 0xffffffffffffff89) {
        dst = (void *)((long)dst + sVar19);
        iVar18 = 0;
        nbSeq = nbSeq + -1;
        if (nbSeq == 0) {
          iVar18 = 5;
          bVar10 = false;
        }
        else {
          bVar10 = true;
          if (local_108.bitsConsumed < 0x41) {
            if (local_108.ptr < local_108.limitPtr) {
              if (local_108.ptr == local_108.start) goto LAB_001e277d;
              uVar11 = (int)local_108.ptr - (int)local_108.start;
              if (local_108.start <=
                  (ulong *)((long)local_108.ptr - (ulong)(local_108.bitsConsumed >> 3))) {
                uVar11 = local_108.bitsConsumed >> 3;
              }
              uVar15 = local_108.bitsConsumed + uVar11 * -8;
            }
            else {
              uVar11 = local_108.bitsConsumed >> 3;
              uVar15 = local_108.bitsConsumed & 7;
            }
            local_108.ptr = (char *)((long)local_108.ptr - (ulong)uVar11);
            local_108.bitsConsumed = uVar15;
            local_108.bitContainer = *(size_t *)local_108.ptr;
          }
        }
      }
      else {
        iVar18 = 1;
        bVar10 = false;
        local_68 = sVar19;
      }
LAB_001e277d:
    } while (iVar18 == 0);
    unaff_RBX = local_68;
    if (iVar18 == 5) {
      unaff_RBX = 0xffffffffffffffec;
      if (nbSeq == 0) {
        if (local_108.bitsConsumed < 0x41) {
          if (local_108.ptr < local_108.limitPtr) {
            if (local_108.ptr != local_108.start) {
              uVar14 = (ulong)(uint)((int)local_108.ptr - (int)local_108.start);
              if (local_108.start <=
                  (ulong *)((long)local_108.ptr - (ulong)(local_108.bitsConsumed >> 3))) {
                uVar14 = (ulong)(local_108.bitsConsumed >> 3);
              }
              uVar11 = local_108.bitsConsumed + (int)uVar14 * -8;
              goto LAB_001e2b3f;
            }
            if (local_108.bitsConsumed == 0x40) goto LAB_001e2a4e;
          }
          else {
            uVar14 = (ulong)(local_108.bitsConsumed >> 3);
            uVar11 = local_108.bitsConsumed & 7;
LAB_001e2b3f:
            local_108.ptr = (char *)((long)local_108.ptr - uVar14);
            local_108.bitsConsumed = uVar11;
            local_108.bitContainer = *(size_t *)local_108.ptr;
          }
          bVar10 = false;
        }
        else {
LAB_001e2a4e:
          lVar12 = 0;
          do {
            (dctx->entropy).rep[lVar12] = (U32)local_b0[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          bVar10 = true;
          unaff_RBX = local_68;
        }
      }
      else {
        bVar10 = false;
      }
    }
  }
  pBVar20 = local_98[0];
  if (!bVar10) {
    return unaff_RBX;
  }
LAB_001e2a83:
  __n = (long)local_98[2] - (long)local_98[1];
  uVar14 = (long)oend - (long)dst;
  if (uVar14 < __n) {
    unaff_RBX = 0xffffffffffffffba;
  }
  else if ((BYTE *)dst == (BYTE *)0x0) {
    dst = (BYTE *)0x0;
  }
  else {
    memcpy(dst,local_98[1],__n);
    dst = (void *)((long)dst + __n);
  }
  if (__n <= uVar14) {
    unaff_RBX = (long)dst - (long)pBVar20;
  }
  return unaff_RBX;
}

Assistant:

DONT_VECTORIZE
ZSTD_decompressSequences_bmi2(ZSTD_DCtx* dctx,
                                 void* dst, size_t maxDstSize,
                           const void* seqStart, size_t seqSize, int nbSeq,
                           const ZSTD_longOffset_e isLongOffset,
                           const int frame)
{
    return ZSTD_decompressSequences_body(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}